

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void BrotliDecoderStateMetablockBegin(BrotliDecoderStateInternal *s)

{
  BrotliDecoderStateInternal *s_local;
  
  s->meta_block_remaining_len = 0;
  s->block_length[0] = 0x1000000;
  s->block_length[1] = 0x1000000;
  s->block_length[2] = 0x1000000;
  s->num_block_types[0] = 1;
  s->num_block_types[1] = 1;
  s->num_block_types[2] = 1;
  s->block_type_rb[0] = 1;
  s->block_type_rb[1] = 0;
  s->block_type_rb[2] = 1;
  s->block_type_rb[3] = 0;
  s->block_type_rb[4] = 1;
  s->block_type_rb[5] = 0;
  s->context_map = (uint8_t *)0x0;
  s->context_modes = (uint8_t *)0x0;
  s->dist_context_map = (uint8_t *)0x0;
  s->context_map_slice = (uint8_t *)0x0;
  s->literal_htree = (HuffmanCode *)0x0;
  s->dist_context_map_slice = (uint8_t *)0x0;
  s->dist_htree_index = '\0';
  s->context_lookup = (uint8_t *)0x0;
  (s->literal_hgroup).codes = (HuffmanCode *)0x0;
  (s->literal_hgroup).htrees = (HuffmanCode **)0x0;
  (s->insert_copy_hgroup).codes = (HuffmanCode *)0x0;
  (s->insert_copy_hgroup).htrees = (HuffmanCode **)0x0;
  (s->distance_hgroup).codes = (HuffmanCode *)0x0;
  (s->distance_hgroup).htrees = (HuffmanCode **)0x0;
  if ((*(ushort *)&s->field_0x338 >> 6 & 1) != 0) {
    (s->literals_block_splits).types[(s->literals_block_splits).num_blocks] =
         (uint8_t)(s->literals_block_splits).num_types_prev_metablocks;
    (s->literals_block_splits).positions_begin[(s->literals_block_splits).num_blocks] = s->pos;
    s->saved_position_literals_begin = 1;
    (s->insert_copy_length_block_splits).types[(s->insert_copy_length_block_splits).num_blocks] =
         (uint8_t)(s->insert_copy_length_block_splits).num_types_prev_metablocks;
    (s->insert_copy_length_block_splits).positions_begin
    [(s->insert_copy_length_block_splits).num_blocks] = s->pos;
    s->saved_position_lengths_begin = 1;
  }
  return;
}

Assistant:

void BrotliDecoderStateMetablockBegin(BrotliDecoderState* s) {
  s->meta_block_remaining_len = 0;
  s->block_length[0] = 1U << 24;
  s->block_length[1] = 1U << 24;
  s->block_length[2] = 1U << 24;
  s->num_block_types[0] = 1;
  s->num_block_types[1] = 1;
  s->num_block_types[2] = 1;
  s->block_type_rb[0] = 1;
  s->block_type_rb[1] = 0;
  s->block_type_rb[2] = 1;
  s->block_type_rb[3] = 0;
  s->block_type_rb[4] = 1;
  s->block_type_rb[5] = 0;
  s->context_map = NULL;
  s->context_modes = NULL;
  s->dist_context_map = NULL;
  s->context_map_slice = NULL;
  s->literal_htree = NULL;
  s->dist_context_map_slice = NULL;
  s->dist_htree_index = 0;
  s->context_lookup = NULL;
  s->literal_hgroup.codes = NULL;
  s->literal_hgroup.htrees = NULL;
  s->insert_copy_hgroup.codes = NULL;
  s->insert_copy_hgroup.htrees = NULL;
  s->distance_hgroup.codes = NULL;
  s->distance_hgroup.htrees = NULL;

  /* If needed save the start of a first in metablock block */
  if (s->save_info_for_recompression) {
    s->literals_block_splits.types[s->literals_block_splits.num_blocks] = s->literals_block_splits.num_types_prev_metablocks;
    s->literals_block_splits.positions_begin[s->literals_block_splits.num_blocks] = s->pos;
    s->saved_position_literals_begin = BROTLI_TRUE;

    s->insert_copy_length_block_splits.types[s->insert_copy_length_block_splits.num_blocks] = s->insert_copy_length_block_splits.num_types_prev_metablocks;
    s->insert_copy_length_block_splits.positions_begin[s->insert_copy_length_block_splits.num_blocks] = s->pos;
    s->saved_position_lengths_begin = BROTLI_TRUE;
  }
}